

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

void __thiscall Js::SmallSpanSequence::Cleanup(SmallSpanSequence *this)

{
  GrowingArray<unsigned_int,_Memory::HeapAllocator> *pGVar1;
  
  pGVar1 = this->pStatementBuffer;
  if (pGVar1 != (GrowingArray<unsigned_int,_Memory::HeapAllocator> *)0x0) {
    JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::~GrowingArray(pGVar1);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pGVar1,0x18);
    this->pStatementBuffer = (GrowingUint32HeapArray *)0x0;
  }
  pGVar1 = this->pActualOffsetList;
  if (pGVar1 != (GrowingArray<unsigned_int,_Memory::HeapAllocator> *)0x0) {
    JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::~GrowingArray(pGVar1);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pGVar1,0x18);
    this->pActualOffsetList = (GrowingUint32HeapArray *)0x0;
  }
  return;
}

Assistant:

void Cleanup()
        {
            if (pStatementBuffer != nullptr)
            {
                HeapDelete(pStatementBuffer);
                pStatementBuffer = nullptr;
            }

            if (pActualOffsetList != nullptr)
            {
                HeapDelete(pActualOffsetList);
                pActualOffsetList = nullptr;
            }
        }